

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O3

void sha256_ni_reset(ssh_hash *hash)

{
  hash[-9].vt = (ssh_hashalg *)0x510e527f9b05688c;
  hash[-9].binarysink_ = (BinarySink *)0x6a09e667bb67ae85;
  hash[-8].vt = (ssh_hashalg *)0x1f83d9ab5be0cd19;
  hash[-8].binarysink_ = (BinarySink *)0x3c6ef372a54ff53a;
  hash[-3].vt = (ssh_hashalg *)0x0;
  hash[-3].binarysink_ = (BinarySink *)0x0;
  return;
}

Assistant:

static void sha256_ni_reset(ssh_hash *hash)
{
    sha256_ni *s = container_of(hash, sha256_ni, hash);

    /* Initialise the core vectors in their storage order */
    s->core[0] = _mm_set_epi64x(
        0x6a09e667bb67ae85ULL, 0x510e527f9b05688cULL);
    s->core[1] = _mm_set_epi64x(
        0x3c6ef372a54ff53aULL, 0x1f83d9ab5be0cd19ULL);

    sha256_block_setup(&s->blk);
}